

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall kratos::VarVarSlice::VarVarSlice(VarVarSlice *this,Var *parent,Var *slice)

{
  unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
  *this_00;
  Var **var;
  pointer puVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  pointer puVar2;
  VarException *pVVar3;
  bool bVar4;
  int iVar5;
  uint32_t uVar6;
  uint uVar7;
  const_iterator cVar8;
  uint64_t uVar9;
  Var *expr;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  __hashtable *__h;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  Var *local_a8;
  Var *local_a0;
  string local_98;
  ulong local_78;
  VarException *local_70;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_68;
  ulong local_48;
  allocator_type local_31;
  
  VarSlice::VarSlice(&this->super_VarSlice,parent,0,0);
  (this->super_VarSlice).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002a34e8;
  this->sliced_var_ = slice;
  puVar1 = (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((((long)(parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 == 4) && (*puVar1 == 1)) &&
     (parent->explicit_array_ == false)) {
    (this->super_VarSlice).super_Var.var_width_ = 1;
    local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68.
                           super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               &(this->super_VarSlice).super_Var.size_,&local_68);
    iVar5 = (*(parent->super_IRNode)._vptr_IRNode[7])(parent);
    (this->super_VarSlice).var_high_ = iVar5 - 1;
    (this->super_VarSlice).var_low_ = 0;
    if (parent->width_param_ != (Var *)0x0) {
      uVar9 = Simulator::static_evaluate_expr(parent->width_param_);
      uVar6 = (uint32_t)uVar9;
      goto LAB_00180739;
    }
    uVar7 = (*(parent->super_IRNode)._vptr_IRNode[7])(parent);
  }
  else {
    (this->super_VarSlice).super_Var.var_width_ = parent->var_width_;
    iVar5 = (*(parent->super_IRNode)._vptr_IRNode[0x18])(parent);
    (this->super_VarSlice).super_Var.is_packed_ = SUB41(iVar5,0);
    puVar1 = (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    __last._M_current =
         (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((ulong)((long)__last._M_current - (long)puVar1) < 5) {
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_68.
                             super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                 &(this->super_VarSlice).super_Var.size_,&local_68);
    }
    else {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(puVar1 + 1),__last,(allocator_type *)&local_98);
      puVar1 = (this->super_VarSlice).super_Var.size_.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (this->super_VarSlice).super_Var.size_.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (this->super_VarSlice).super_Var.size_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_68.
                    super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      (this->super_VarSlice).super_Var.size_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_68.
                    super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      (this->super_VarSlice).super_Var.size_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)local_68.
                    super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((puVar1 != (pointer)0x0) &&
         (operator_delete(puVar1,(long)puVar2 - (long)puVar1),
         local_68.
         super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>._M_impl
         .super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_68.
                        super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    uVar6 = (*(parent->super_IRNode)._vptr_IRNode[0x25])(parent);
    (this->super_VarSlice).var_high_ = uVar6;
    uVar6 = (*(parent->super_IRNode)._vptr_IRNode[0x26])(parent);
    (this->super_VarSlice).var_low_ = uVar6;
    local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_68.
                          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    this_00 = &parent->size_param_;
    cVar8 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,(key_type *)&local_68);
    if (cVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>._M_cur
        != (__node_type *)0x0) {
      cVar8 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,(key_type *)&local_68);
      if (cVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>.
          _M_cur == (__node_type *)0x0) {
LAB_001808bc:
        std::__throw_out_of_range("_Map_base::at");
      }
      if (*(long *)((long)cVar8.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>
                          ._M_cur + 0x10) != 0) {
        local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)local_68.
                              super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
        cVar8 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this_00->_M_h,(key_type *)&local_68);
        if (cVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>.
            _M_cur == (__node_type *)0x0) {
          expr = (Var *)0x0;
        }
        else {
          cVar8 = std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&this_00->_M_h,(key_type *)&local_68);
          if (cVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>.
              _M_cur == (__node_type *)0x0) goto LAB_001808bc;
          expr = *(Var **)((long)cVar8.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>
                                 ._M_cur + 0x10);
        }
        uVar9 = Simulator::static_evaluate_expr(expr);
        uVar7 = (uint)uVar9;
        goto LAB_00180731;
      }
    }
    uVar7 = *(parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
  }
LAB_00180731:
  uVar6 = clog2(uVar7);
LAB_00180739:
  var = &this->sliced_var_;
  uVar7 = (*((*var)->super_IRNode)._vptr_IRNode[7])();
  if (uVar7 <= uVar6) {
    return;
  }
  bVar4 = IterVar::has_iter_var(*var);
  if ((bVar4) && (bVar4 = IterVar::safe_to_resize(*var,uVar6,false), bVar4)) {
    IterVar::fix_width(var,uVar6);
    uVar7 = (*((*var)->super_IRNode)._vptr_IRNode[7])();
    if (uVar6 == uVar7) {
      return;
    }
  }
  IterVar::safe_to_resize(*var,uVar6,false);
  local_70 = (VarException *)__cxa_allocate_exception(0x10);
  local_78 = (ulong)*(parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (*((*var)->super_IRNode)._vptr_IRNode[7])();
  local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)((int)local_78 - 1);
  local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)uVar6;
  local_48 = (ulong)uVar7;
  format_str.size_ = 0x222;
  format_str.data_ = (char *)0x44;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_68;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_98,
             (detail *)"Bit extraction of array[{0}:0] requires {1} bit index, not {2} bits.",
             format_str,args);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_a8;
  local_a8 = parent;
  local_a0 = slice;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_68,__l,&local_31);
  pVVar3 = local_70;
  VarException::VarException(local_70,&local_98,&local_68);
  __cxa_throw(pVVar3,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

VarVarSlice::VarVarSlice(kratos::Var *parent, kratos::Var *slice)
    : VarSlice(parent, 0, 0), sliced_var_(slice) {
    // check the size or width
    // we need to re-compute var_high, var_low, width, and other stuff by ourselves here
    // there is an issue about the var_high and var_low; the problem will only show up during
    // the connectivity check
    // TODO: fix this
    uint32_t required_width;
    if (parent->size().size() == 1 && parent->size().front() == 1 && !parent->explicit_array()) {
        // slice through the 1D array
        // so the width will be 1
        var_width_ = 1;
        size_ = {1};
        // potentially cover all the bits
        var_high_ = parent->width() - 1;
        var_low_ = 0;
        if (parent->width_param())
            required_width = Simulator::static_evaluate_expr(parent->width_param());
        else
            required_width = clog2(parent->width());
    } else {
        var_width_ = parent->var_width();
        is_packed_ = parent->is_packed();
        // peel one layer
        if (parent->size().size() > 1)
            size_ = std::vector<uint32_t>(parent->size().begin() + 1, parent->size().end());
        else
            size_ = {1};
        var_high_ = parent->var_high();
        var_low_ = parent->var_low();
        // we need to compute the clog2 here
        if (parent->get_size_param(0))
            required_width = clog2(Simulator::static_evaluate_expr(parent->get_size_param(0)));
        else
            required_width = clog2(parent->size().front());
    }
    if (required_width < sliced_var_->width()) {
        // may need to demote the variable if it's a var cast
        bool has_error = true;
        if (IterVar::has_iter_var(sliced_var_)) {
            if (IterVar::safe_to_resize(sliced_var_, required_width, false)) {
                IterVar::fix_width(sliced_var_, required_width);
                has_error = false;
            }
        }
        if (has_error || required_width != sliced_var_->width()) {
            // error message copied from verilator
            IterVar::safe_to_resize(sliced_var_, required_width, false);
            throw VarException(
                ::format("Bit extraction of array[{0}:0] requires {1} bit index, not {2} bits.",
                         parent->size().front() - 1, required_width, sliced_var_->width()),
                {parent, slice});
        }
    }
}